

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonChain.cpp
# Opt level: O3

Value * __thiscall xmrig::JsonChain::getValue(JsonChain *this,char *key)

{
  pointer pGVar1;
  pointer pGVar2;
  Number in_RAX;
  pointer pGVar3;
  undefined8 local_38;
  
  pGVar3 = (this->m_chain).
           super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = in_RAX;
  do {
    if (pGVar3 == (this->m_chain).
                  super__Vector_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      return (Value *)kNullValue;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&stack0xffffffffffffffc8,(Ch *)(pGVar3 + -1));
    pGVar2 = pGVar3 + -1;
    pGVar1 = pGVar3 + -1;
    pGVar3 = pGVar3 + -1;
  } while (local_38 ==
           (ulong)(pGVar1->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_.s.length * 0x20 +
           ((ulong)(pGVar2->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ).data_.s.str & 0xffffffffffff));
  return (Value *)(local_38 + 0x10);
}

Assistant:

const rapidjson::Value &xmrig::JsonChain::getValue(const char *key) const
{
    for (auto it = m_chain.rbegin(); it != m_chain.rend(); ++it) {
        auto i = it->FindMember(key);
        if (i != it->MemberEnd()) {
            return i->value;
        }
    }

    return kNullValue;
}